

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall tinyusdz::MaterialBinding::MaterialBinding(MaterialBinding *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->materialBinding).has_value_ = false;
  memset(&(this->materialBindingFull).contained,0,0x308);
  (this->_materialBindingMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->_materialBindingMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_materialBindingMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&(this->materialBinding).contained,0,0x309);
  memset(&(this->materialBindingPreview).contained,0,0x309);
  (this->_materialBindingMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_materialBindingMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_materialBindingMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_materialBindingCollectionMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_materialBindingCollectionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->_materialBindingCollectionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_materialBindingCollectionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_materialBindingCollectionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_materialBindingCollectionMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

static value::token kAllPurpose() {
    return value::token("");
  }